

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetAdaptivityMethod(void *arkode_mem,int imethod,int idefault,int pq,realtype *adapt_params)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_R8;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffb8;
  ARKodeMem in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                               in_stack_ffffffffffffffb8,(ARKodeHAdaptMem *)0x114abe5);
  if (local_4 == 0) {
    if ((in_ESI < 6) && (-1 < in_ESI)) {
      *(int *)((long)in_stack_ffffffffffffffc8 + 0x60) = in_ESI;
      *(uint *)((long)in_stack_ffffffffffffffc8 + 0xb8) = (uint)(in_ECX != 0);
      if (in_EDX == 1) {
        switch(*(undefined4 *)((long)in_stack_ffffffffffffffc8 + 0x60)) {
        case 0:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3fe28f5c28f5c28f;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = 0x3fcae147ae147ae1;
          *(undefined1 **)((long)in_stack_ffffffffffffffc8 + 0xa8) = &DAT_3fb999999999999a;
          break;
        case 1:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3fe999999999999a;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = 0x3fd3d70a3d70a3d7;
          break;
        case 2:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3ff0000000000000;
          break;
        case 3:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3fd77ced916872b0;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = 0x3fd126e978d4fdf4;
          break;
        case 4:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3fef5c28f5c28f5c;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = 0x3fee666666666666;
          break;
        case 5:
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = 0x3fd77ced916872b0;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = 0x3fd126e978d4fdf4;
          *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa8) = 0x3fee666666666666;
        }
      }
      else {
        *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0x98) = *in_R8;
        *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa0) = in_R8[1];
        *(undefined8 *)((long)in_stack_ffffffffffffffc8 + 0xa8) = in_R8[2];
      }
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffc0,-0x16,"ARKode","arkSetAdaptivityMethod",
                      "Illegal imethod");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int arkSetAdaptivityMethod(void *arkode_mem, int imethod, int idefault,
                           int pq, realtype adapt_params[3])
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetAdaptivityMethod",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for allowable parameters */
  if ((imethod > ARK_ADAPT_IMEX_GUS) || (imethod < ARK_ADAPT_PID)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetAdaptivityMethod", "Illegal imethod");
    return(ARK_ILL_INPUT);
  }

  /* set adaptivity method */
  hadapt_mem->imethod = imethod;

  /* set flag whether to use p (embedding, 0) or q (method, 1) order */
  hadapt_mem->pq = (pq != 0);

  /* set method parameters */
  if (idefault == 1) {
    switch (hadapt_mem->imethod) {
    case (ARK_ADAPT_PID):
      hadapt_mem->k1 = AD0_K1;
      hadapt_mem->k2 = AD0_K2;
      hadapt_mem->k3 = AD0_K3; break;
    case (ARK_ADAPT_PI):
      hadapt_mem->k1 = AD1_K1;
      hadapt_mem->k2 = AD1_K2; break;
    case (ARK_ADAPT_I):
      hadapt_mem->k1 = AD2_K1; break;
    case (ARK_ADAPT_EXP_GUS):
      hadapt_mem->k1 = AD3_K1;
      hadapt_mem->k2 = AD3_K2; break;
    case (ARK_ADAPT_IMP_GUS):
      hadapt_mem->k1 = AD4_K1;
      hadapt_mem->k2 = AD4_K2; break;
    case (ARK_ADAPT_IMEX_GUS):
      hadapt_mem->k1 = AD5_K1;
      hadapt_mem->k2 = AD5_K2;
      hadapt_mem->k3 = AD5_K3; break;
    }
  } else {
    hadapt_mem->k1 = adapt_params[0];
    hadapt_mem->k2 = adapt_params[1];
    hadapt_mem->k3 = adapt_params[2];
  }

  return(ARK_SUCCESS);
}